

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void detectEWMH(void)

{
  Atom *supportedAtoms_00;
  unsigned_long atomCount_00;
  unsigned_long uVar1;
  unsigned_long atomCount;
  Atom *supportedAtoms;
  Atom wmSupported;
  Atom supportingWmCheck;
  Window *windowFromChild;
  Window *windowFromRoot;
  char *in_stack_ffffffffffffffd8;
  
  supportedAtoms_00 = (Atom *)XInternAtom(_glfw.x11.display,"_NET_SUPPORTING_WM_CHECK",0);
  atomCount_00 = XInternAtom(_glfw.x11.display,"_NET_SUPPORTED",0);
  uVar1 = _glfwGetWindowPropertyX11
                    ((Window)windowFromChild,supportingWmCheck,wmSupported,(uchar **)supportedAtoms)
  ;
  if (uVar1 != 0) {
    _glfwGrabErrorHandlerX11();
    uVar1 = _glfwGetWindowPropertyX11
                      ((Window)windowFromChild,supportingWmCheck,wmSupported,
                       (uchar **)supportedAtoms);
    if (uVar1 == 0) {
      XFree(0);
    }
    else {
      _glfwReleaseErrorHandlerX11();
      XFree(0);
      XFree(0);
      _glfwGetWindowPropertyX11
                ((Window)windowFromChild,supportingWmCheck,wmSupported,(uchar **)supportedAtoms);
      _glfw.x11.NET_WM_STATE =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_STATE_ABOVE =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_STATE_FULLSCREEN =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_STATE_DEMANDS_ATTENTION =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_WINDOW_TYPE =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_ACTIVE_WINDOW =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_FRAME_EXTENTS =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
           getSupportedAtom(supportedAtoms_00,atomCount_00,in_stack_ffffffffffffffd8);
      if (in_stack_ffffffffffffffd8 != (char *)0x0) {
        XFree(in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

static void detectEWMH(void)
{
    Window* windowFromRoot = NULL;
    Window* windowFromChild = NULL;

    // First we need a couple of atoms
    const Atom supportingWmCheck =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTING_WM_CHECK", False);
    const Atom wmSupported =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTED", False);

    // Then we look for the _NET_SUPPORTING_WM_CHECK property of the root window
    if (!_glfwGetWindowPropertyX11(_glfw.x11.root,
                                   supportingWmCheck,
                                   XA_WINDOW,
                                   (unsigned char**) &windowFromRoot))
    {
        return;
    }

    _glfwGrabErrorHandlerX11();

    // It should be the ID of a child window (of the root)
    // Then we look for the same property on the child window
    if (!_glfwGetWindowPropertyX11(*windowFromRoot,
                                   supportingWmCheck,
                                   XA_WINDOW,
                                   (unsigned char**) &windowFromChild))
    {
        XFree(windowFromRoot);
        return;
    }

    _glfwReleaseErrorHandlerX11();

    // It should be the ID of that same child window
    if (*windowFromRoot != *windowFromChild)
    {
        XFree(windowFromRoot);
        XFree(windowFromChild);
        return;
    }

    XFree(windowFromRoot);
    XFree(windowFromChild);

    // We are now fairly sure that an EWMH-compliant window manager is running

    Atom* supportedAtoms;
    unsigned long atomCount;

    // Now we need to check the _NET_SUPPORTED property of the root window
    // It should be a list of supported WM protocol and state atoms
    atomCount = _glfwGetWindowPropertyX11(_glfw.x11.root,
                                          wmSupported,
                                          XA_ATOM,
                                          (unsigned char**) &supportedAtoms);

    // See which of the atoms we support that are supported by the WM
    _glfw.x11.NET_WM_STATE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE");
    _glfw.x11.NET_WM_STATE_ABOVE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_ABOVE");
    _glfw.x11.NET_WM_STATE_FULLSCREEN =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_FULLSCREEN");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_VERT");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_HORZ");
    _glfw.x11.NET_WM_STATE_DEMANDS_ATTENTION =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_DEMANDS_ATTENTION");
    _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_FULLSCREEN_MONITORS");
    _glfw.x11.NET_WM_WINDOW_TYPE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE");
    _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE_NORMAL");
    _glfw.x11.NET_ACTIVE_WINDOW =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_ACTIVE_WINDOW");
    _glfw.x11.NET_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_FRAME_EXTENTS");
    _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_REQUEST_FRAME_EXTENTS");

    if (supportedAtoms)
        XFree(supportedAtoms);
}